

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O0

void __thiscall SocketLog::flush(SocketLog *this)

{
  bool bVar1;
  reference pvVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  SocketLog *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->msgQueueMutex);
  while( true ) {
    bVar1 = std::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->msgQueue);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar2 = std::
             queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front(&this->msgQueue);
    send(this,(int)pvVar2,__buf,in_RCX,in_R8D);
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(&this->msgQueue);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void SocketLog::flush() {
    std::lock_guard<std::mutex> lock(msgQueueMutex);

    while (!msgQueue.empty()) {
        send(msgQueue.front());
        msgQueue.pop();
    }
}